

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

PathTypeSetterSlotIndex * __thiscall
Js::PathTypeHandlerBase::UpdateSetterSlots
          (PathTypeHandlerBase *this,Recycler *recycler,PathTypeSetterSlotIndex *oldSetters,
          uint8 oldPathSize,uint8 newTypePathSize)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  BOOL BVar5;
  Recycler *this_00;
  undefined4 *puVar6;
  PathTypeSetterSlotIndex *pPVar7;
  ulong uVar9;
  byte bVar10;
  undefined7 in_register_00000081;
  undefined1 local_68 [8];
  TrackAllocData data;
  ulong uVar8;
  
  uVar8 = CONCAT71(in_register_00000081,newTypePathSize) & 0xffffffff;
  local_68 = (undefined1  [8])&unsigned_char::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_9d33d42;
  data.filename._0_4_ = 0x900;
  data.plusSize = uVar8;
  this_00 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_68);
  if ((int)CONCAT71(in_register_00000081,newTypePathSize) == 0) {
    Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
    pPVar7 = &DAT_00000008;
  }
  else {
    BVar5 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      data._32_8_ = this;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00dd28b0;
      *puVar6 = 0;
      this = (PathTypeHandlerBase *)data._32_8_;
    }
    pPVar7 = (PathTypeSetterSlotIndex *)
             Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                       (this_00,uVar8);
    if (pPVar7 == (PathTypeSetterSlotIndex *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) {
LAB_00dd28b0:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
  }
  if (oldSetters == (PathTypeSetterSlotIndex *)0x0) {
    bVar4 = 0;
  }
  else {
    uVar8 = (ulong)oldPathSize;
    if (newTypePathSize < oldPathSize) {
      uVar8 = (ulong)newTypePathSize;
    }
    bVar4 = (byte)uVar8;
    if (bVar4 != 0) {
      uVar1 = (this->super_DynamicTypeHandler).unusedBytes;
      uVar9 = 0;
      do {
        bVar10 = oldSetters[uVar9];
        if (uVar1 >> 1 <= (ushort)bVar10) {
          bVar10 = 0xff;
        }
        pPVar7[uVar9] = bVar10;
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
    }
  }
  if (bVar4 < newTypePathSize) {
    memset(pPVar7 + bVar4,0xff,(ulong)(byte)(~bVar4 + newTypePathSize) + 1);
  }
  return pPVar7;
}

Assistant:

PathTypeSetterSlotIndex * PathTypeHandlerBase::UpdateSetterSlots(Recycler * recycler, PathTypeSetterSlotIndex * oldSetters, uint8 oldPathSize, uint8 newTypePathSize)
    {
        PathTypeSetterSlotIndex * newSetters = RecyclerNewArrayLeaf(recycler, PathTypeSetterSlotIndex, newTypePathSize);
        uint8 initStart;
        if (oldSetters == nullptr)
        {
            initStart = 0;
        }
        else
        {
            uint16 pathLength = GetPathLength();
            // In branching cases, the new type path may be shorter than the old.
            initStart = min(newTypePathSize, oldPathSize);
            for (uint8 i = 0; i < initStart; i++)
            {
                // Only copy setter indices that refer to the part of the path contained by this handler already.
                // Otherwise, wait for the correct index, which may be different on this path of the branch,
                // to be set when the setter property is added to the handler.
                PathTypeSetterSlotIndex oldIndex = oldSetters[i];
                newSetters[i] = oldIndex < pathLength ? oldIndex : NoSetterSlot;
            }
        }
        for (uint8 i = initStart; i < newTypePathSize; i++)
        {
            newSetters[i] = NoSetterSlot;
        }

        return newSetters;
    }